

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O0

double opengv::relative_pose::modules::fivept_nister::polyVal(MatrixXd *p,double x)

{
  CoeffReturnType pdVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t power;
  double value;
  size_t degree;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  undefined8 local_20;
  undefined1 extraout_var [56];
  
  local_28 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                       ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0xeb8bd9);
  local_20 = 0.0;
  for (; local_28 != 0; local_28 = local_28 + -1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       (in_stack_ffffffffffffffd0,
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0xeb8c15);
    in_stack_ffffffffffffffd0 =
         (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)*pdVar1;
    auVar2._0_8_ = std::pow<double,int>((double)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc)
    ;
    auVar2._8_56_ = extraout_var;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = in_stack_ffffffffffffffd0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_20;
    auVar3 = vfmadd213sd_fma(auVar2._0_16_,auVar3,auVar4);
    local_20 = auVar3._0_8_;
  }
  return local_20;
}

Assistant:

double
opengv::relative_pose::modules::fivept_nister::polyVal(
    const Eigen::MatrixXd & p,
    double x)
{
  size_t degree = p.cols();
  double value = 0.0;
  for( size_t power = degree; power > 0; power--)
      value += p(0, (int)(degree-power))*pow(x,(int)(power-1));

  return value;
}